

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O1

void Minisat::selectionSort<unsigned_int,reduceDB_tch>(uint *array,int size,reduceDB_tch lt)

{
  ulong uVar1;
  ulong *puVar2;
  ulong *puVar3;
  uint uVar4;
  uint *puVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (1 < size) {
    puVar5 = ((lt.ca)->super_RegionAllocator<unsigned_int>).memory;
    uVar7 = 1;
    uVar8 = 0;
    do {
      uVar1 = uVar8 + 1;
      uVar10 = uVar8 & 0xffffffff;
      uVar9 = uVar7;
      do {
        puVar2 = (ulong *)(puVar5 + array[uVar9]);
        puVar3 = (ulong *)(puVar5 + array[(int)(uint)uVar10]);
        uVar6 = (uint)uVar9;
        if (*(uint *)((long)puVar3 + (*puVar3 >> 0x22) * 4 + 0xc) <=
            *(uint *)((long)puVar2 + (*puVar2 >> 0x22) * 4 + 0xc)) {
          uVar6 = (uint)uVar10;
        }
        uVar9 = uVar9 + 1;
        uVar10 = (ulong)uVar6;
      } while ((uint)size != uVar9);
      uVar4 = array[uVar8];
      array[uVar8] = array[(int)uVar6];
      array[(int)uVar6] = uVar4;
      uVar7 = uVar7 + 1;
      uVar8 = uVar1;
    } while (uVar1 != size - 1);
  }
  return;
}

Assistant:

void selectionSort(T *array, int size, LessThan lt)
{
    int i, j, best_i;
    T tmp;

    for (i = 0; i < size - 1; i++) {
        best_i = i;
        for (j = i + 1; j < size; j++) {
            if (lt(array[j], array[best_i])) best_i = j;
        }
        tmp = array[i];
        array[i] = array[best_i];
        array[best_i] = tmp;
    }
}